

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

void __thiscall
Fl_Tree_Item::draw_horizontal_connector(Fl_Tree_Item *this,int x1,int x2,int y,Fl_Tree_Prefs *prefs)

{
  int xx;
  uint uVar1;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)prefs->_connectorcolor);
  if (prefs->_connectorstyle == FL_TREE_CONNECTOR_DOTTED) {
    for (uVar1 = x1 | 1; (int)uVar1 <= x2; uVar1 = uVar1 + 2) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                (fl_graphics_driver,(ulong)uVar1,(ulong)(y | 1));
    }
  }
  else if (prefs->_connectorstyle == FL_TREE_CONNECTOR_SOLID) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
              (fl_graphics_driver,(ulong)(uint)x1,(ulong)(y | 1U),(ulong)(uint)x2,(ulong)(y | 1U));
    return;
  }
  return;
}

Assistant:

void Fl_Tree_Item::draw_horizontal_connector(int x1, int x2, int y, const Fl_Tree_Prefs &prefs) {
  fl_color(prefs.connectorcolor());
  switch ( prefs.connectorstyle() ) {
    case FL_TREE_CONNECTOR_SOLID:
      y |= 1;				// force alignment w/dot pattern
      fl_line(x1,y,x2,y);
      return;
    case FL_TREE_CONNECTOR_DOTTED: 
    {
      y  |= 1;				// force alignment w/dot pattern
      x1 |= 1;
      for ( int xx=x1; xx<=x2; xx+=2 ) {
	fl_point(xx, y);
      }
      return;
    }
    case FL_TREE_CONNECTOR_NONE:
      return;
  }
}